

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Lookup(ShardedLRUCache *this,Slice *key)

{
  uint32_t hash_00;
  uint32_t uVar1;
  Handle *pHVar2;
  uint32_t hash;
  Slice *key_local;
  ShardedLRUCache *this_local;
  
  hash_00 = HashSlice(key);
  uVar1 = Shard(hash_00);
  pHVar2 = LRUCache::Lookup(this->shard_ + uVar1,key,hash_00);
  return pHVar2;
}

Assistant:

virtual Handle *Lookup(const Slice &key) {
                const uint32_t hash = HashSlice(key);
                return shard_[Shard(hash)].Lookup(key, hash);
            }